

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O0

Ptr __thiscall
features::Visualizer::draw_keypoints
          (Visualizer *this,ConstPtr *image,
          vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
          *matches,KeypointStyle style)

{
  int iVar1;
  ImageBase *pIVar2;
  size_type sVar3;
  element_type *image_00;
  const_reference keypoint;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar4;
  ulong local_a8;
  size_t i;
  uint8_t *color;
  shared_ptr<core::Image<unsigned_char>_> local_88;
  shared_ptr<const_core::Image<unsigned_char>_> local_78;
  shared_ptr<core::Image<unsigned_char>_> local_68;
  shared_ptr<const_core::Image<unsigned_char>_> local_58;
  shared_ptr<core::Image<unsigned_char>_> local_48 [2];
  undefined1 local_25;
  KeypointStyle local_24;
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  *pvStack_20;
  KeypointStyle style_local;
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  *matches_local;
  ConstPtr *image_local;
  Ptr *ret;
  
  local_25 = 0;
  local_24 = style;
  pvStack_20 = matches;
  matches_local =
       (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> *)
       image;
  image_local = (ConstPtr *)this;
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)this);
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar1 = core::ImageBase::channels(pIVar2);
  if (iVar1 == 3) {
    std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_58,image);
    core::image::desaturate<unsigned_char>((image *)local_48,&local_58,DESATURATE_AVERAGE);
    std::shared_ptr<core::Image<unsigned_char>_>::operator=
              ((shared_ptr<core::Image<unsigned_char>_> *)this,local_48);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(local_48);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_58);
    std::shared_ptr<core::Image<unsigned_char>const>::shared_ptr<core::Image<unsigned_char>,void>
              ((shared_ptr<core::Image<unsigned_char>const> *)&local_78,
               (shared_ptr<core::Image<unsigned_char>_> *)this);
    core::image::expand_grayscale<unsigned_char>((image *)&local_68,(ConstPtr *)&local_78);
    std::shared_ptr<core::Image<unsigned_char>_>::operator=
              ((shared_ptr<core::Image<unsigned_char>_> *)this,&local_68);
    std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_68);
    std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_78);
  }
  else {
    pIVar2 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar1 = core::ImageBase::channels(pIVar2);
    if (iVar1 == 1) {
      std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr
                ((shared_ptr<const_core::Image<unsigned_char>_> *)&color,image);
      core::image::expand_grayscale<unsigned_char>
                ((image *)&local_88,(shared_ptr<const_core::Image<unsigned_char>_> *)&color);
      std::shared_ptr<core::Image<unsigned_char>_>::operator=
                ((shared_ptr<core::Image<unsigned_char>_> *)this,&local_88);
      std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr(&local_88);
      std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr
                ((shared_ptr<const_core::Image<unsigned_char>_> *)&color);
    }
  }
  for (local_a8 = 0;
      sVar3 = std::
              vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              ::size(pvStack_20), local_a8 < sVar3; local_a8 = local_a8 + 1) {
    image_00 = std::
               __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    keypoint = std::
               vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
               ::operator[](pvStack_20,local_a8);
    draw_keypoint(image_00,keypoint,local_24,(anonymous_namespace)::color_table + 9);
  }
  PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

core::ByteImage::Ptr
Visualizer::draw_keypoints(core::ByteImage::ConstPtr image,
    std::vector<Visualizer::Keypoint> const& matches,
    Visualizer::KeypointStyle style)
{
    core::ByteImage::Ptr ret;
    if (image->channels() == 3)
    {
        ret = core::image::desaturate<unsigned char>(image, core::image::DESATURATE_AVERAGE);
        ret = core::image::expand_grayscale<unsigned char>(ret);
    }
    else if (image->channels() == 1)
    {
        ret = core::image::expand_grayscale<unsigned char>(image);
    }

    uint8_t* color = color_table[3];
    for (std::size_t i = 0; i < matches.size(); ++i)
    {
        Visualizer::draw_keypoint(*ret, matches[i], style, color);
    }

    return ret;
}